

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O1

int __thiscall Dymon::read_status(Dymon *this,uint8_t mode)

{
  int iVar1;
  uint32_t count;
  uint8_t _statusRequest [3];
  undefined1 local_24 [4];
  
  iVar1 = (*this->_vptr_Dymon[1])(this,local_24,3,0);
  if (iVar1 < 1) {
    iVar1 = -3;
  }
  else {
    count = (*this->_vptr_Dymon[2])(this,this->status,0x20);
    if ((int)count < 1) {
      iVar1 = -4;
    }
    else {
      iVar1 = 0;
      if (dymonDebug != 0) {
        log_status((uint)mode,this->status,count);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int Dymon::read_status(uint8_t mode) //request a status update
{
   uint8_t _statusRequest[] = {
      0x1B, 0x41, 0           //(A) status request
   };
   _statusRequest[2] = mode;

   int status = this->send(_statusRequest, sizeof(_statusRequest));
   if (status <= 0)
   {
      return -3;
   }
   status = this->receive(this->status, sizeof(this->status));
   if (status <= 0)
   {
      return -4;
   }
#if 1
   if (dymonDebug)
   {
      log_status(mode, this->status, status);
   }
#endif
   //success
   return 0;
}